

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O2

kvtree_elem * kvtree_elem_init(kvtree_elem *elem,char *key,kvtree *hash)

{
  char *pcVar1;
  
  if (elem != (kvtree_elem *)0x0) {
    if (key == (char *)0x0) {
      elem->key = (char *)0x0;
      kvtree_err("Setting hash element key to NULL @ %s:%d",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                 ,0x6b);
    }
    else {
      pcVar1 = strdup(key);
      elem->key = pcVar1;
    }
    elem->hash = hash;
  }
  return elem;
}

Assistant:

static kvtree_elem* kvtree_elem_init(kvtree_elem* elem, const char* key, kvtree* hash)
{
  if (elem != NULL) {
    if (key != NULL) {
      elem->key = strdup(key);
    } else {
      /* bad idea to allow key to be set to NULL */
      elem->key = NULL;
      kvtree_err("Setting hash element key to NULL @ %s:%d",
        __FILE__, __LINE__
      );
    }
    elem->hash = hash;
  }
  return elem;
}